

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForkNode.cpp
# Opt level: O1

void __thiscall ForkNode::printOutcomingEdges(ForkNode *this,ostream *ostream)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  string local_70;
  string local_50;
  
  Node::printOutcomingEdges(&this->super_Node,ostream);
  for (p_Var2 = (this->forkSuccessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->forkSuccessors_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    Node::dotName_abi_cxx11_(&local_50,&this->super_Node);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (ostream,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," -> ",4);
    Node::dotName_abi_cxx11_(&local_70,*(Node **)(p_Var2 + 1));
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_70._M_dataplus._M_p,local_70._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," [style=dashed]\n",0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void ForkNode::printOutcomingEdges(ostream &ostream) const {
    Node::printOutcomingEdges(ostream);
    for (const auto &forkSuccessor : forkSuccessors_) {
        ostream << this->dotName() << " -> " << forkSuccessor->dotName()
                << " [style=dashed]\n";
    }
}